

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O2

void __thiscall
chrono::ChBodyEasyCylinder::SetupBody
          (ChBodyEasyCylinder *this,double radius,double height,double density,bool visualize,
          bool collide,shared_ptr<chrono::ChMaterialSurface> *material)

{
  shared_ptr<chrono::collision::ChCollisionModel> *psVar1;
  undefined1 auVar2 [16];
  undefined7 in_register_00000011;
  undefined1 auVar3 [16];
  shared_ptr<chrono::ChVisualModel> vmodel;
  shared_ptr<chrono::ChVisualShape> local_158;
  shared_ptr<chrono::ChCylinderShape> vshape;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_128;
  ChVector<double> local_118;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  local_e8 = radius * radius;
  uStack_e0 = 0;
  local_f8 = local_e8 * 3.141592653589793 * height * density;
  uStack_f0 = 0;
  (this->super_ChBody).density = (float)density;
  ChVariablesBodyOwnMass::SetBodyMass(&(this->super_ChBody).variables,local_f8);
  auVar2._8_8_ = uStack_e0;
  auVar2._0_8_ = local_e8;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = height * height;
  auVar3 = vfmadd231sd_fma(auVar3,auVar2,ZEXT816(0x4008000000000000));
  auVar3 = vunpcklpd_avx(auVar3,auVar2);
  local_b8._vptr_ChFrame = (_func_int **)(auVar3._0_8_ * local_f8 * 0.08333333333333333);
  local_b8.coord.pos.m_data[0] =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auVar3._8_8_ * local_f8 * 0.5);
  local_b8.coord.pos.m_data[1] = (double)vmovlpd_avx((undefined1  [16])local_b8._0_16_);
  ChBody::SetInertiaXX(&this->super_ChBody,(ChVector<double> *)&local_b8);
  if ((int)CONCAT71(in_register_00000011,collide) != 0) {
    if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      __assert_fail("material",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                    ,0xa4,
                    "void chrono::ChBodyEasyCylinder::SetupBody(double, double, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                   );
    }
    psVar1 = &(this->super_ChBody).collision_model;
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_b8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)((long)*local_b8._vptr_ChFrame + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_b8 + 8));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_118,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,
               &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
    ;
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_b8,1.0);
    (*(*(_func_int ***)local_118.m_data[0])[8])
              (radius,radius,height * 0.5,local_118.m_data[0],&local_138,&local_d8,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118.m_data + 1));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_b8,
               &psVar1->
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>)
    ;
    (**(code **)((long)*local_b8._vptr_ChFrame + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_b8 + 8));
    ChBody::SetCollide(&this->super_ChBody,true);
  }
  if (visualize) {
    chrono_types::make_shared<chrono::ChCylinderShape,_0>();
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p1.m_data[0] = 0.0;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p1.m_data[1] = height * -0.5;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p1.m_data[2] = 0.0;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p2.m_data[0] = 0.0;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p2.m_data[1] = height * 0.5;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).p2.m_data[2] = 0.0;
    ((vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    gcylinder).rad = radius;
    std::make_shared<chrono::ChVisualModel>();
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChCylinderShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_158,
               &vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>);
    local_d8.m_data[0] = 1.0;
    local_118.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
    local_118.m_data[0] = 0.0;
    local_118.m_data[1] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_b8,&local_118,&local_d8);
    ChVisualModel::AddShape
              (vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_158,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,
               &vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>);
    ChPhysicsItem::AddVisualModel
              ((ChPhysicsItem *)this,(shared_ptr<chrono::ChVisualModel> *)&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vmodel.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&vshape.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void ChBodyEasyCylinder::SetupBody(double radius,
                                   double height,
                                   double density,
                                   bool visualize,
                                   bool collide,
                                   std::shared_ptr<ChMaterialSurface> material) {
    double mmass = density * (CH_C_PI * pow(radius, 2) * height);

    this->SetDensity((float)density);
    this->SetMass(mmass);
    this->SetInertiaXX(ChVector<>((1.0 / 12.0) * mmass * (3 * pow(radius, 2) + pow(height, 2)),
                                  0.5 * mmass * pow(radius, 2),
                                  (1.0 / 12.0) * mmass * (3 * pow(radius, 2) + pow(height, 2))));
    if (collide) {
        assert(material);
        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddCylinder(material, radius, radius, height * 0.5);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }
    if (visualize) {
        auto vshape = chrono_types::make_shared<ChCylinderShape>();
        vshape->GetCylinderGeometry().p1 = ChVector<>(0, -height * 0.5, 0);
        vshape->GetCylinderGeometry().p2 = ChVector<>(0, height * 0.5, 0);
        vshape->GetCylinderGeometry().rad = radius;
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }
}